

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_stream_test.c
# Opt level: O1

void test_tcp_listen_activation(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_stream *s;
  nng_stream *s_00;
  char local_a8 [8];
  char url [32];
  nng_iov iov1;
  nng_iov iov2;
  nng_stream_dialer *d;
  uint local_58;
  char buf2 [4];
  int port;
  char buf1 [4];
  nng_stream_listener *l2;
  nng_stream_listener *l1;
  nng_aio *pnStack_38;
  int fd;
  nng_aio *aio1;
  nng_aio *aio2;
  
  nuts_scratch_addr_zero("tcp4",0x40,test_tcp_listen_activation::nuts_addr_);
  nVar1 = nng_aio_alloc(&stack0xffffffffffffffc8,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,199,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio1, NULL, NULL)"
                         ,pcVar3,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_aio_alloc(&aio1,(_func_void_void_ptr *)0x0,(void *)0x0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                           ,200,"%s: expected success, got %s (%d)",
                           "nng_aio_alloc(&aio2, NULL, NULL)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nng_aio_set_timeout(pnStack_38,2000);
      nng_aio_set_timeout(aio1,2000);
      nVar1 = nng_stream_listener_alloc(&l2,test_tcp_listen_activation::nuts_addr_);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                             ,0xcd,"%s: expected success, got %s (%d)",
                             "nng_stream_listener_alloc(&l1, addr)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_stream_listener_listen(l2);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                               ,0xce,"%s: expected success, got %s (%d)",
                               "nng_stream_listener_listen(l1)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_stream_listener_get_int(l2,"tcp-bound-port",(int *)&local_58);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                 ,0xd0,"%s: expected success, got %s (%d)",
                                 "nng_stream_listener_get_int(l1, NNG_OPT_TCP_BOUND_PORT, &port)",
                                 pcVar3,nVar1);
          if (iVar2 != 0) {
            snprintf(local_a8,0x20,"tcp4://127.0.0.1:%u",(ulong)local_58);
            nVar1 = nng_stream_dialer_alloc((nng_stream_dialer **)&iov2.iov_len,local_a8);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                   ,0xd3,"%s: expected success, got %s (%d)",
                                   "nng_stream_dialer_alloc(&d, url)",pcVar3,nVar1);
            if (iVar2 != 0) {
              nVar1 = nng_stream_listener_get_int(l2,"listen-fd",(int *)((long)&l1 + 4));
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                     ,0xd5,"%s: expected success, got %s (%d)",
                                     "nng_stream_listener_get_int(l1, NNG_OPT_LISTEN_FD, &fd)",
                                     pcVar3,nVar1);
              if (iVar2 != 0) {
                l1._4_4_ = dup(l1._4_4_);
                iVar2 = acutest_check_((uint)(-2 < l1._4_4_),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                       ,0xda,"%s","fd >= -1");
                if (iVar2 != 0) {
                  nVar1 = nng_stream_listener_alloc((nng_stream_listener **)&port,"tcp4://");
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                         ,0xdc,"%s: expected success, got %s (%d)",
                                         "nng_stream_listener_alloc(&l2, \"tcp4://\")",pcVar3,nVar1)
                  ;
                  if (iVar2 != 0) {
                    nVar1 = nng_stream_listener_set_int(_port,"listen-fd",l1._4_4_);
                    pcVar3 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                           ,0xdd,"%s: expected success, got %s (%d)",
                                           "nng_stream_listener_set_int(l2, NNG_OPT_LISTEN_FD, fd)",
                                           pcVar3,nVar1);
                    if (iVar2 != 0) {
                      nng_stream_dialer_dial((nng_stream_dialer *)iov2.iov_len,aio1);
                      nng_stream_listener_accept(_port,pnStack_38);
                      nng_aio_wait(pnStack_38);
                      nng_aio_wait(aio1);
                      nVar1 = nng_aio_result(pnStack_38);
                      pcVar3 = nng_strerror(nVar1);
                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                             ,0xe4,"%s: expected success, got %s (%d)",
                                             "nng_aio_result(aio1)",pcVar3,nVar1);
                      if (iVar2 != 0) {
                        nVar1 = nng_aio_result(aio1);
                        pcVar3 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                               ,0xe5,"%s: expected success, got %s (%d)",
                                               "nng_aio_result(aio2)",pcVar3,nVar1);
                        if (iVar2 != 0) {
                          s = (nng_stream *)nng_aio_get_output(pnStack_38,0);
                          s_00 = (nng_stream *)nng_aio_get_output(aio1,0);
                          url._24_8_ = buf2;
                          iov1.iov_buf = (void *)0x4;
                          iov1.iov_len = (long)&d + 4;
                          iov2.iov_buf = (void *)0x4;
                          nng_aio_set_iov(pnStack_38,1,(nng_iov *)(url + 0x18));
                          nng_aio_set_iov(aio1,1,(nng_iov *)&iov1.iov_len);
                          builtin_strncpy(buf2,"abc",4);
                          nng_stream_send(s,pnStack_38);
                          nng_stream_recv(s_00,aio1);
                          nng_aio_wait(pnStack_38);
                          nng_aio_wait(aio1);
                          nVar1 = nng_aio_result(pnStack_38);
                          pcVar3 = nng_strerror(nVar1);
                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                 ,0x100,"%s: expected success, got %s (%d)",
                                                 "nng_aio_result(aio1)",pcVar3,nVar1);
                          if (iVar2 != 0) {
                            nVar1 = nng_aio_result(aio1);
                            pcVar3 = nng_strerror(nVar1);
                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                  ,0x101,"%s: expected success, got %s (%d)",
                                                  "nng_aio_result(aio2)",pcVar3,nVar1);
                            if (iVar2 != 0) {
                              iVar2 = strcmp(buf2,(char *)((long)&d + 4));
                              acutest_check_((uint)(iVar2 == 0),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                             ,0x103,"%s == %s",buf2,(char *)((long)&d + 4),nVar1);
                              nng_stream_listener_free(l2);
                              nng_stream_listener_free(_port);
                              nng_stream_dialer_free((nng_stream_dialer *)iov2.iov_len);
                              nng_stream_free(s);
                              nng_stream_free(s_00);
                              nng_aio_free(pnStack_38);
                              nng_aio_free(aio1);
                              return;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_tcp_listen_activation(void)
{
#if defined(NNG_PLATFORM_POSIX)
	nng_stream_listener *l1;
	nng_stream_listener *l2;
	char                *addr;
	int                  fd;
	int                  port;
	nng_aio             *aio1;
	nng_aio             *aio2;
	nng_stream_dialer   *d;
	nng_stream          *c1, *c2;
	char                 url[32];

	NUTS_ADDR_ZERO(addr, "tcp4");
	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio2, NULL, NULL));

	nng_aio_set_timeout(aio1, 2000);
	nng_aio_set_timeout(aio2, 2000);

	NUTS_PASS(nng_stream_listener_alloc(&l1, addr));
	NUTS_PASS(nng_stream_listener_listen(l1));
	NUTS_PASS(
	    nng_stream_listener_get_int(l1, NNG_OPT_TCP_BOUND_PORT, &port));

	snprintf(url, sizeof(url), "tcp4://127.0.0.1:%u", port);
	NUTS_PASS(nng_stream_dialer_alloc(&d, url));

	NUTS_PASS(nng_stream_listener_get_int(l1, NNG_OPT_LISTEN_FD, &fd));
	fd = dup(fd);
	// dupe this because we need to separate the file descriptors to
	// prevent confusion when we clean up (only one FD can be registered at
	// a time!)
	NUTS_ASSERT(fd >= -1);

	NUTS_PASS(nng_stream_listener_alloc(&l2, "tcp4://"));
	NUTS_PASS(nng_stream_listener_set_int(l2, NNG_OPT_LISTEN_FD, fd));
	nng_stream_dialer_dial(d, aio2);
	nng_stream_listener_accept(l2, aio1);

	nng_aio_wait(aio1);
	nng_aio_wait(aio2);

	NUTS_PASS(nng_aio_result(aio1));
	NUTS_PASS(nng_aio_result(aio2));

	c1 = nng_aio_get_output(aio1, 0);
	c2 = nng_aio_get_output(aio2, 0);

	char    buf1[4];
	char    buf2[4];
	nng_iov iov1;
	nng_iov iov2;

	iov1.iov_buf = buf1;
	iov1.iov_len = sizeof(buf1);

	iov2.iov_buf = buf2;
	iov2.iov_len = sizeof(buf2);

	nng_aio_set_iov(aio1, 1, &iov1);
	nng_aio_set_iov(aio2, 1, &iov2);

	snprintf(buf1, sizeof(buf1), "abc");

	nng_stream_send(c1, aio1);
	nng_stream_recv(c2, aio2);

	nng_aio_wait(aio1);
	nng_aio_wait(aio2);

	NUTS_PASS(nng_aio_result(aio1));
	NUTS_PASS(nng_aio_result(aio2));

	NUTS_MATCH(buf1, buf2);

	nng_stream_listener_free(l1);
	nng_stream_listener_free(l2);
	nng_stream_dialer_free(d);
	nng_stream_free(c1);
	nng_stream_free(c2);
	nng_aio_free(aio1);
	nng_aio_free(aio2);
#elif defined(NNG_PLATFORM_WINDOWS)
	// Windows requires that we not have created an I/O completion port yet
	// on the incoming FD.
	nng_stream_listener *l2;
	SOCKET               s;
	char                *addr;
	int                  port;
	nng_aio             *aio1;
	nng_aio             *aio2;
	nng_stream_dialer   *d;
	nng_stream          *c1, *c2;
	char                 url[32];
	SOCKADDR_IN          sin;

	NUTS_ADDR_ZERO(addr, "tcp4");
	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio2, NULL, NULL));

	nng_aio_set_timeout(aio1, 20000);
	nng_aio_set_timeout(aio2, 20000);

	s                   = socket(AF_INET, SOCK_STREAM, 0);
	sin.sin_family      = AF_INET;
	sin.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
	sin.sin_port        = 0;
	int len             = sizeof(sin);
	NUTS_ASSERT(bind(s, (SOCKADDR *) &sin, sizeof(sin)) == 0);
	NUTS_ASSERT(getsockname(s, (SOCKADDR *) &sin, &len) == 0);
	port = ntohs(sin.sin_port);
	NUTS_ASSERT(listen(s, SOMAXCONN) == 0);

	NUTS_PASS(nng_stream_listener_alloc(&l2, "tcp4://"));
	NUTS_PASS(nng_stream_listener_set_int(l2, NNG_OPT_LISTEN_FD, (int) s));
	snprintf(url, sizeof(url), "tcp://127.0.0.1:%u", port);
	NUTS_PASS(nng_stream_dialer_alloc(&d, url));
	nng_stream_listener_accept(l2, aio1);

	nng_stream_dialer_dial(d, aio2);

	nng_aio_wait(aio1);
	NUTS_PASS(nng_aio_result(aio1));

	nng_aio_wait(aio2);
	NUTS_PASS(nng_aio_result(aio2));

	c1 = nng_aio_get_output(aio1, 0);
	c2 = nng_aio_get_output(aio2, 0);

	char    buf1[4];
	char    buf2[4];
	nng_iov iov1;
	nng_iov iov2;

	iov1.iov_buf = buf1;
	iov1.iov_len = sizeof(buf1);

	iov2.iov_buf = buf2;
	iov2.iov_len = sizeof(buf2);

	nng_aio_set_iov(aio1, 1, &iov1);
	nng_aio_set_iov(aio2, 1, &iov2);

	snprintf(buf1, sizeof(buf1), "abc");

	nng_stream_send(c1, aio1);
	nng_stream_recv(c2, aio2);

	nng_aio_wait(aio1);
	nng_aio_wait(aio2);

	NUTS_PASS(nng_aio_result(aio1));
	NUTS_PASS(nng_aio_result(aio2));

	NUTS_MATCH(buf1, buf2);

	nng_stream_listener_free(l2);
	nng_stream_dialer_free(d);
	nng_stream_free(c1);
	nng_stream_free(c2);
	nng_aio_free(aio1);
	nng_aio_free(aio2);
#else
	NUTS_SKIP("Not Windows or POSIX");
#endif
}